

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS
ref_search_nearest_candidates_closer_than
          (REF_SEARCH ref_search,REF_LIST ref_list,REF_DBL *position,REF_DBL distance)

{
  uint uVar1;
  uint uVar2;
  REF_DBL trim_radius;
  REF_DBL local_30;
  
  local_30 = distance;
  ref_search_trim(ref_search,0,position,&local_30);
  uVar1 = ref_search_touching(ref_search,ref_list,position,local_30);
  uVar2 = 0;
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x17f,
           "ref_search_nearest_candidates_closer_than",(ulong)uVar1,"touches");
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_search_nearest_candidates_closer_than(
    REF_SEARCH ref_search, REF_LIST ref_list, REF_DBL *position,
    REF_DBL distance) {
  REF_DBL trim_radius;
  REF_INT parent;

  parent = 0;
  trim_radius = distance;
  RSS(ref_search_trim(ref_search, parent, position, &trim_radius), "trim");
  RSS(ref_search_touching(ref_search, ref_list, position, trim_radius),
      "touches");

  return REF_SUCCESS;
}